

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

CFG * __thiscall spirv_cross::Compiler::get_cfg_for_function(Compiler *this,uint32_t id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->function_cfgs)._M_h._M_bucket_count;
  uVar3 = (ulong)id % uVar1;
  p_Var4 = (this->function_cfgs)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, *(uint32_t *)&p_Var4->_M_nxt[1]._M_nxt != id)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, *(uint *)&p_Var2[1]._M_nxt == id)) goto LAB_002c394d;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_002c394d:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    __assert_fail("cfg_itr != end(function_cfgs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0xfbb,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
  }
  if ((CFG *)p_Var2[2]._M_nxt == (CFG *)0x0) {
    __assert_fail("cfg_itr->second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0xfbc,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
  }
  return (CFG *)p_Var2[2]._M_nxt;
}

Assistant:

const CFG &Compiler::get_cfg_for_function(uint32_t id) const
{
	auto cfg_itr = function_cfgs.find(id);
	assert(cfg_itr != end(function_cfgs));
	assert(cfg_itr->second);
	return *cfg_itr->second;
}